

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Collision_PDU::Collision_PDU
          (Collision_PDU *this,EntityIdentifier *IssuingID,EntityIdentifier *CollidingID,
          EntityIdentifier *EventID,CollisionType CT,Vector *Velocity,KFLOAT32 Mass,Vector *Location
          )

{
  KFLOAT32 Mass_local;
  Vector *Velocity_local;
  CollisionType CT_local;
  EntityIdentifier *EventID_local;
  EntityIdentifier *CollidingID_local;
  EntityIdentifier *IssuingID_local;
  Collision_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Collision_PDU_0032aee8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_IssuingEntityID,IssuingID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_CollidingEntityID,CollidingID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID,EventID);
  this->m_ui8CollisionType = (KUINT8)CT;
  this->m_ui8Padding = '\0';
  DATA_TYPE::Vector::Vector(&this->m_Velocity,Velocity);
  this->m_f32Mass = Mass;
  DATA_TYPE::Vector::Vector(&this->m_Location,Location);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui8PDUType = '\x04';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Collision_PDU::Collision_PDU( const EntityIdentifier & IssuingID, const EntityIdentifier & CollidingID,
                              const EntityIdentifier & EventID, CollisionType CT,const Vector & Velocity,
                              KFLOAT32 Mass, const Vector & Location ) :
    m_IssuingEntityID( IssuingID ),
    m_CollidingEntityID( CollidingID ),
    m_EventID( EventID ),
    m_ui8CollisionType( CT ),
    m_ui8Padding( 0 ),
    m_Velocity( Velocity ),
    m_f32Mass( Mass ),
    m_Location( Location )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Collision_PDU_Type;
    m_ui16PDULength = COLLISION_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}